

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O1

void __thiscall
gl4cts::CopyImage::TargetMissMatchTest::TargetMissMatchTest
          (TargetMissMatchTest *this,Context *context)

{
  pointer *pptVar1;
  GLenum GVar2;
  iterator iVar3;
  GLenum dst_target;
  long lVar4;
  GLuint target;
  long lVar5;
  uint uVar6;
  testCase test_case;
  testCase local_48;
  vector<gl4cts::CopyImage::TargetMissMatchTest::testCase,std::allocator<gl4cts::CopyImage::TargetMissMatchTest::testCase>>
  *local_38;
  
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"target_miss_match",
             "Test verifies if INVALID_ENUM is generated when target provided to CopySubImageData does not match texture"
            );
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TargetMissMatchTest_02109588;
  local_38 = (vector<gl4cts::CopyImage::TargetMissMatchTest::testCase,std::allocator<gl4cts::CopyImage::TargetMissMatchTest::testCase>>
              *)&this->m_test_cases;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::TargetMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::TargetMissMatchTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::TargetMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::TargetMissMatchTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::TargetMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::TargetMissMatchTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_dst_buf_name = 0;
  this->m_dst_tex_name = 0;
  this->m_src_buf_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  lVar5 = 0;
  do {
    GVar2 = (&s_valid_targets)[lVar5];
    uVar6 = 0xfffffffb;
    lVar4 = 0;
    do {
      local_48.m_dst_target = *(GLenum *)((long)&s_valid_targets + lVar4);
      local_48.m_expected_result = 0x500;
      if (lVar4 != 0 && lVar5 != 0) {
        if (local_48.m_dst_target == GVar2) {
          local_48.m_expected_result = 0;
        }
        if (uVar6 < 2 == (int)lVar5 - 5U < 2) {
          iVar3._M_current =
               (this->m_test_cases).
               super__Vector_base<gl4cts::CopyImage::TargetMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::TargetMissMatchTest::testCase>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (this->m_test_cases).
              super__Vector_base<gl4cts::CopyImage::TargetMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::TargetMissMatchTest::testCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_48.m_tex_target = GVar2;
            local_48.m_src_target = GVar2;
            std::
            vector<gl4cts::CopyImage::TargetMissMatchTest::testCase,std::allocator<gl4cts::CopyImage::TargetMissMatchTest::testCase>>
            ::_M_realloc_insert<gl4cts::CopyImage::TargetMissMatchTest::testCase_const&>
                      (local_38,iVar3,&local_48);
          }
          else {
            (iVar3._M_current)->m_tex_target = GVar2;
            (iVar3._M_current)->m_src_target = GVar2;
            (iVar3._M_current)->m_dst_target = local_48.m_dst_target;
            (iVar3._M_current)->m_expected_result = local_48.m_expected_result;
            pptVar1 = &(this->m_test_cases).
                       super__Vector_base<gl4cts::CopyImage::TargetMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::TargetMissMatchTest::testCase>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pptVar1 = *pptVar1 + 1;
          }
        }
      }
      uVar6 = uVar6 + 1;
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x2c);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xb);
  lVar5 = 0;
  do {
    GVar2 = (&s_valid_targets)[lVar5];
    uVar6 = 0xfffffffb;
    lVar4 = 0;
    do {
      local_48.m_src_target = *(GLenum *)((long)&s_valid_targets + lVar4);
      local_48.m_expected_result = 0x500;
      if (lVar4 != 0 && lVar5 != 0) {
        if (local_48.m_src_target == GVar2) {
          local_48.m_expected_result = 0;
        }
        if (uVar6 < 2 == (int)lVar5 - 5U < 2) {
          iVar3._M_current =
               (this->m_test_cases).
               super__Vector_base<gl4cts::CopyImage::TargetMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::TargetMissMatchTest::testCase>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (this->m_test_cases).
              super__Vector_base<gl4cts::CopyImage::TargetMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::TargetMissMatchTest::testCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_48.m_tex_target = GVar2;
            local_48.m_dst_target = GVar2;
            std::
            vector<gl4cts::CopyImage::TargetMissMatchTest::testCase,std::allocator<gl4cts::CopyImage::TargetMissMatchTest::testCase>>
            ::_M_realloc_insert<gl4cts::CopyImage::TargetMissMatchTest::testCase_const&>
                      (local_38,iVar3,&local_48);
          }
          else {
            (iVar3._M_current)->m_tex_target = GVar2;
            (iVar3._M_current)->m_src_target = local_48.m_src_target;
            (iVar3._M_current)->m_dst_target = GVar2;
            (iVar3._M_current)->m_expected_result = local_48.m_expected_result;
            pptVar1 = &(this->m_test_cases).
                       super__Vector_base<gl4cts::CopyImage::TargetMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::TargetMissMatchTest::testCase>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pptVar1 = *pptVar1 + 1;
          }
        }
      }
      uVar6 = uVar6 + 1;
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x2c);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xb);
  return;
}

Assistant:

TargetMissMatchTest::TargetMissMatchTest(deqp::Context& context)
	: TestCase(
		  context, "target_miss_match",
		  "Test verifies if INVALID_ENUM is generated when target provided to CopySubImageData does not match texture")
	, m_dst_buf_name(0)
	, m_dst_tex_name(0)
	, m_src_buf_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{
	/* Wrong dst target */
	for (GLuint target = 0; target < s_n_valid_targets; ++target)
	{
		for (GLuint dst = 0; dst < s_n_valid_targets; ++dst)
		{
			const GLenum dst_target = s_valid_targets[dst];
			const GLenum src_target = s_valid_targets[target];
			const GLenum tex_target = s_valid_targets[target];
			testCase	 test_case  = { tex_target, src_target, dst_target, GL_INVALID_ENUM };

			/* Skip renderbuffers */
			if ((GL_RENDERBUFFER == tex_target) || (GL_RENDERBUFFER == dst_target) || (GL_RENDERBUFFER == src_target))
			{
				continue;
			}

			/* Valid case */
			if (dst_target == tex_target)
			{
				test_case.m_expected_result = GL_NO_ERROR;
			}

			/* Skip cases with multisampling conflict */
			if (Utils::isTargetMultisampled(dst_target) != Utils::isTargetMultisampled(src_target))
			{
				continue;
			}

			m_test_cases.push_back(test_case);
		}
	}

	/* Wrong src target */
	for (GLuint target = 0; target < s_n_valid_targets; ++target)
	{
		for (GLuint src = 0; src < s_n_valid_targets; ++src)
		{
			const GLenum dst_target = s_valid_targets[target];
			const GLenum src_target = s_valid_targets[src];
			const GLenum tex_target = s_valid_targets[target];
			testCase	 test_case  = { tex_target, src_target, dst_target, GL_INVALID_ENUM };

			/* Skip renderbuffers */
			if ((GL_RENDERBUFFER == tex_target) || (GL_RENDERBUFFER == dst_target) || (GL_RENDERBUFFER == src_target))
			{
				continue;
			}

			/* Valid case */
			if (src_target == tex_target)
			{
				test_case.m_expected_result = GL_NO_ERROR;
			}

			/* Skip cases with multisampling conflict */
			if (Utils::isTargetMultisampled(dst_target) != Utils::isTargetMultisampled(src_target))
			{
				continue;
			}

			m_test_cases.push_back(test_case);
		}
	}
}